

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int luaopen_base(lua_State *L)

{
  uint uVar1;
  GCstr *pGVar2;
  TValue *pTVar3;
  GCtab *t;
  
  uVar1 = (L->env).gcptr32;
  pGVar2 = lj_str_new(L,"_G",2);
  pTVar3 = lj_tab_setstr(L,(GCtab *)(ulong)uVar1,pGVar2);
  (pTVar3->u32).lo = uVar1;
  (pTVar3->field_2).it = 0xfffffff4;
  lua_pushlstring(L,"Lua 5.1",7);
  t = lj_tab_new(L,0,1);
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  (pTVar3->u32).lo = (uint32_t)t;
  (pTVar3->field_2).it = 0xfffffff4;
  (t->metatable).gcptr32 = (uint32_t)t;
  pGVar2 = lj_str_new(L,"__mode",6);
  pTVar3 = lj_tab_setstr(L,t,pGVar2);
  pGVar2 = lj_str_new(L,"kv",2);
  (pTVar3->u32).lo = (uint32_t)pGVar2;
  (pTVar3->field_2).it = 0xfffffffb;
  t->nomm = 0xf7;
  lj_lib_register(L,"_G","\x02",lj_lib_cf_base);
  lj_lib_register(L,"coroutine",lj_lib_init_coroutine,lj_lib_cf_coroutine);
  return 2;
}

Assistant:

LUALIB_API int luaopen_base(lua_State *L)
{
  /* NOBARRIER: Table and value are the same. */
  GCtab *env = tabref(L->env);
  settabV(L, lj_tab_setstr(L, env, lj_str_newlit(L, "_G")), env);
  lua_pushliteral(L, LUA_VERSION);  /* top-3. */
  newproxy_weaktable(L);  /* top-2. */
  LJ_LIB_REG(L, "_G", base);
  LJ_LIB_REG(L, LUA_COLIBNAME, coroutine);
  return 2;
}